

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O3

void __thiscall AbstractTxIn_IsCoinBaseTest_Test::TestBody(AbstractTxIn_IsCoinBaseTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar__2;
  Txid empty_txid;
  AssertionResult gtest_ar_;
  AbstractTxIn not_coinbase;
  AbstractTxIn coinbase_input;
  AssertHelper AStack_228;
  Txid local_220;
  undefined1 local_200 [32];
  Txid local_1e0;
  undefined1 local_1c0 [40];
  uint32_t local_198;
  Script local_190;
  uint32_t local_158;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_148;
  undefined1 local_130 [40];
  uint32_t local_108;
  Script local_100;
  uint32_t local_c8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_b8;
  AbstractTxIn local_a0;
  
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_a0);
  cfd::core::Txid::Txid(&local_1e0,(ByteData256 *)&local_a0);
  if (local_a0._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_a0._vptr_AbstractTxIn,
                    (long)local_a0.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)local_a0._vptr_AbstractTxIn);
  }
  cfd::core::AbstractTxIn::AbstractTxIn(&local_a0,&local_1e0,0xffffffff,0xffffffff);
  local_1c0[0] = (internal)cfd::core::AbstractTxIn::IsCoinBase(&local_a0);
  local_1c0._8_8_ = (_func_int **)0x0;
  if (!(bool)local_1c0[0]) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)local_1c0,
               (AssertionResult *)"coinbase_input.IsCoinBase()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x80,(char *)local_130._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_200,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_200);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    if (local_220._vptr_Txid != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_220._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_220._vptr_Txid + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxIn::AbstractTxIn((AbstractTxIn *)local_130,&local_1e0,0xffffffff,0);
  cfd::core::Txid::operator=(&local_a0.txid_,(Txid *)(local_130 + 8));
  local_a0.vout_ = local_108;
  cfd::core::Script::operator=(&local_a0.unlocking_script_,&local_100);
  local_a0.sequence_ = local_c8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&local_a0.script_witness_.witness_stack_,&local_b8);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_130);
  local_1c0[0] = (internal)cfd::core::AbstractTxIn::IsCoinBase(&local_a0);
  local_1c0._8_8_ = (_func_int **)0x0;
  if (!(bool)local_1c0[0]) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)local_1c0,
               (AssertionResult *)"coinbase_input.IsCoinBase()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x84,(char *)local_130._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_200,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_200);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    if (local_220._vptr_Txid != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_220._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_220._vptr_Txid + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxIn::AbstractTxIn((AbstractTxIn *)local_130,&local_1e0,0,0xffffffff);
  bVar1 = cfd::core::AbstractTxIn::IsCoinBase((AbstractTxIn *)local_130);
  local_220._vptr_Txid = (_func_int **)CONCAT71(local_220._vptr_Txid._1_7_,!bVar1);
  local_220.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)&local_220,
               (AssertionResult *)"not_coinbase.IsCoinBase()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x88,(char *)CONCAT71(local_1c0._1_7_,local_1c0[0]));
    testing::internal::AssertHelper::operator=(&AStack_228,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_228);
    if ((undefined1 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) != local_1c0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1c0._1_7_,local_1c0[0]),local_1c0._16_8_ + 1);
    }
    if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_200._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_220.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_200._0_8_ = (AssertHelperData *)(local_200 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"0d2a5386ec4fe2afb6fbf31b5d51781645ba8bd4a56daa1e7645bd4c4c4646d9",
             "");
  cfd::core::Txid::Txid(&local_220,(string *)local_200);
  cfd::core::AbstractTxIn::AbstractTxIn((AbstractTxIn *)local_1c0,&local_220,0xffffffff,0xffffffff);
  cfd::core::Txid::operator=((Txid *)(local_130 + 8),(Txid *)(local_1c0 + 8));
  local_108 = local_198;
  cfd::core::Script::operator=(&local_100,&local_190);
  local_c8 = local_158;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&local_b8,&local_148);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_1c0);
  local_220._vptr_Txid = (_func_int **)&PTR__Txid_007d4398;
  if (local_220.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_220.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_220.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_220.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)(local_200 + 0x10)) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  bVar1 = cfd::core::AbstractTxIn::IsCoinBase((AbstractTxIn *)local_130);
  local_220._vptr_Txid = (_func_int **)CONCAT71(local_220._vptr_Txid._1_7_,!bVar1);
  local_220.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)&local_220,
               (AssertionResult *)"not_coinbase.IsCoinBase()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x8d,(char *)CONCAT71(local_1c0._1_7_,local_1c0[0]));
    testing::internal::AssertHelper::operator=(&AStack_228,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_228);
    if ((undefined1 *)CONCAT71(local_1c0._1_7_,local_1c0[0]) != local_1c0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1c0._1_7_,local_1c0[0]),local_1c0._16_8_ + 1);
    }
    if ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_200._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_200._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_220.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_130);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_a0);
  local_1e0._vptr_Txid = (_func_int **)&PTR__Txid_007d4398;
  if (local_1e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(AbstractTxIn, IsCoinBaseTest) {
  const Txid empty_txid = Txid(ByteData256());
  const uint32_t max_vout = std::numeric_limits<uint32_t>::max();
  const uint32_t sequence = 4294967295;
  AbstractTxIn coinbase_input = AbstractTxIn(
    empty_txid, max_vout, sequence);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  coinbase_input = AbstractTxIn(
    empty_txid, max_vout, 0);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  AbstractTxIn not_coinbase = AbstractTxIn(
    empty_txid, 0, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());

  not_coinbase = AbstractTxIn(
    Txid("0d2a5386ec4fe2afb6fbf31b5d51781645ba8bd4a56daa1e7645bd4c4c4646d9"),
    max_vout, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());
}